

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
cpsm::decode<cpsm::SimpleStringTraits>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,cpsm *this,string_ref str)

{
  string_ref str_00;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_00.len_ = (size_t)str.ptr_;
  str_00.ptr_ = (char *)this;
  decode_to<cpsm::SimpleStringTraits>(str_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename StringTraits::Char> decode(boost::string_ref const str) {
  std::vector<typename StringTraits::Char> vec;
  decode_to<StringTraits>(str, vec);
  return vec;
}